

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::util_reportModelSolution(HModel *this)

{
  int iVar1;
  HModel *this_00;
  allocator_type local_b1;
  vector<double,_std::allocator<double>_> rowDual;
  vector<double,_std::allocator<double>_> rowPrimal;
  vector<int,_std::allocator<int>_> rowStatus;
  vector<int,_std::allocator<int>_> colStatus;
  vector<double,_std::allocator<double>_> colDual;
  vector<double,_std::allocator<double>_> colPrimal;
  
  puts("util_reportModelSolution:");
  printf("Model %s has %d columns, %d rows and %d nonzeros\n",(this->modelName)._M_dataplus._M_p,
         (long)this->numCol,(ulong)(uint)this->numRow,
         (ulong)(uint)(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[this->numCol]);
  util_reportModelObjSense(this);
  util_reportModelStatus(this);
  if (this->numTot < 0x65) {
    std::vector<double,_std::allocator<double>_>::vector
              (&colPrimal,(long)this->numCol,(allocator_type *)&colDual);
    std::vector<double,_std::allocator<double>_>::vector
              (&colDual,(long)this->numCol,(allocator_type *)&colStatus);
    std::vector<int,_std::allocator<int>_>::vector
              (&colStatus,(long)this->numCol,(allocator_type *)&rowPrimal);
    std::vector<double,_std::allocator<double>_>::vector
              (&rowPrimal,(long)this->numRow,(allocator_type *)&rowDual);
    std::vector<double,_std::allocator<double>_>::vector
              (&rowDual,(long)this->numRow,(allocator_type *)&rowStatus);
    std::vector<int,_std::allocator<int>_>::vector(&rowStatus,(long)this->numRow,&local_b1);
    util_getPrimalDualValues(this,&colPrimal,&colDual,&rowPrimal,&rowDual);
    this_00 = this;
    iVar1 = util_convertWorkingToBaseStat
                      (this,colStatus.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                       rowStatus.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (iVar1 == 0) {
      util_reportColVecSol
                (this_00,this->numCol,&this->colCost,&this->colLower,&this->colUpper,&colPrimal,
                 &colDual,&colStatus);
      util_reportRowVecSol
                (this_00,this->numRow,&this->rowLower,&this->rowUpper,&rowPrimal,&rowDual,&rowStatus
                );
    }
    if (rowStatus.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(rowStatus.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (rowDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(rowDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (rowPrimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(rowPrimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (colStatus.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(colStatus.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (colDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(colDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (colPrimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(colPrimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HModel::util_reportModelSolution() {
#ifdef JAJH_dev
  printf("util_reportModelSolution:\n");
#endif
  util_reportModelDimensions();
  util_reportModelObjSense();
  util_reportModelStatus();
  if (numTot>100) return;
  assert(numCol>0);
  assert(numRow>0);
  vector<double> colPrimal(numCol);
  vector<double> colDual(numCol);
  vector<int> colStatus(numCol);
  vector<double> rowPrimal(numRow);
  vector<double> rowDual(numRow);
  vector<int> rowStatus(numRow);
  util_getPrimalDualValues(colPrimal, colDual, rowPrimal, rowDual);
  if (util_convertWorkingToBaseStat(&colStatus[0], &rowStatus[0])) return;
  util_reportColVecSol(numCol, colCost, colLower, colUpper, colPrimal, colDual, colStatus);
  util_reportRowVecSol(numRow, rowLower, rowUpper, rowPrimal, rowDual, rowStatus);
}